

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall HSlider::on_mouse_button_hold(HSlider *this,int mx,int my)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar1 == '\0') {
    uVar2 = ~(this->super_Widget).x1;
    dVar3 = (double)(int)(mx + uVar2) / (double)(uVar2 + (this->super_Widget).x2);
    dVar4 = 1.0;
    if (dVar3 <= 1.0) {
      dVar4 = dVar3;
    }
    if (dVar4 <= 0.0) {
      dVar4 = 0.0;
    }
    *(int *)&(this->super_Widget).field_0x34 = (int)((double)this->max_value * dVar4);
    ((this->super_Widget).dialog)->draw_requested = true;
  }
  return;
}

Assistant:

void HSlider::on_mouse_button_hold(int mx, int my)
{
   if (is_disabled())
      return;

   double r = (double) (mx - 1 - this->x1) / (this->width() - 2);
   r = CLAMP(0.0, r, 1.0);
   cur_value = (int) (r * max_value);
   dialog->request_draw();

   (void)my;
}